

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avrogencpp.cc
# Opt level: O0

string * cppNameOf_abi_cxx11_(NodePtr *n)

{
  Type TVar1;
  type pNVar2;
  shared_ptr<avro::Node> *in_RSI;
  string *in_RDI;
  Name *in_stack_ffffffffffffff48;
  allocator<char> *in_stack_ffffffffffffff70;
  allocator<char> *paVar3;
  char *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  allocator<char> local_41 [20];
  allocator<char> local_2d;
  allocator<char> local_2c;
  allocator<char> local_2b;
  allocator<char> local_2a;
  allocator<char> local_29;
  allocator<char> local_28;
  allocator<char> local_27;
  allocator<char> local_26;
  allocator<char> local_25 [13];
  NodePtr *in_stack_ffffffffffffffe8;
  
  pNVar2 = boost::shared_ptr<avro::Node>::operator->(in_RSI);
  TVar1 = avro::Node::type(pNVar2);
  switch(TVar1) {
  case AVRO_STRING:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    std::allocator<char>::~allocator(local_25);
    break;
  case AVRO_BYTES:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    std::allocator<char>::~allocator(&local_26);
    break;
  case AVRO_INT:
    this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_27;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    std::allocator<char>::~allocator(&local_27);
    break;
  case AVRO_LONG:
    paVar3 = &local_28;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff80,(char *)paVar3,in_stack_ffffffffffffff70);
    std::allocator<char>::~allocator(&local_28);
    break;
  case AVRO_FLOAT:
    paVar3 = &local_29;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,paVar3);
    std::allocator<char>::~allocator(&local_29);
    break;
  case AVRO_DOUBLE:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    std::allocator<char>::~allocator(&local_2a);
    break;
  case AVRO_BOOL:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    std::allocator<char>::~allocator(&local_2b);
    break;
  case AVRO_NULL:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffef);
    break;
  case AVRO_RECORD:
  case AVRO_ENUM:
  case AVRO_FIXED:
    pNVar2 = boost::shared_ptr<avro::Node>::operator->(in_RSI);
    (*pNVar2->_vptr_Node[3])();
    decorate_abi_cxx11_(in_stack_ffffffffffffff48);
    break;
  case AVRO_ARRAY:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    std::allocator<char>::~allocator(&local_2c);
    break;
  case AVRO_MAP:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    std::allocator<char>::~allocator(&local_2d);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    std::allocator<char>::~allocator(local_41);
    break;
  case AVRO_NUM_TYPES:
    avro::resolveSymbol((NodePtr *)in_RDI);
    cppNameOf_abi_cxx11_(in_stack_ffffffffffffffe8);
    boost::shared_ptr<avro::Node>::~shared_ptr((shared_ptr<avro::Node> *)0x1bbbb2);
  }
  return in_RDI;
}

Assistant:

static string cppNameOf(const NodePtr& n)
{
    switch (n->type()) {
    case avro::AVRO_NULL:
        return "null";
    case avro::AVRO_STRING:
        return "string";
    case avro::AVRO_BYTES:
        return "bytes";
    case avro::AVRO_INT:
        return "int";
    case avro::AVRO_LONG:
        return "long";
    case avro::AVRO_FLOAT:
        return "float";
    case avro::AVRO_DOUBLE:
        return "double";
    case avro::AVRO_BOOL:
        return "bool";
    case avro::AVRO_RECORD:
    case avro::AVRO_ENUM:
    case avro::AVRO_FIXED:
        return decorate(n->name());
    case avro::AVRO_ARRAY:
        return "array";
    case avro::AVRO_MAP:
        return "map";
    case avro::AVRO_SYMBOLIC:
        return cppNameOf(resolveSymbol(n));
    default:
        return "$Undefined$";
    }
}